

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O1

pint p_ini_file_parameter_int(PIniFile *file,pchar *section,pchar *key,pint default_val)

{
  pchar *__nptr;
  
  __nptr = pp_ini_file_find_parameter(file,section,key);
  if (__nptr != (pchar *)0x0) {
    default_val = atoi(__nptr);
    p_free(__nptr);
  }
  return default_val;
}

Assistant:

P_LIB_API pint
p_ini_file_parameter_int (const PIniFile	*file,
			  const pchar		*section,
			  const pchar		*key,
			  pint			default_val)
{
	pchar	*val;
	pint	ret;

	if ((val = pp_ini_file_find_parameter (file, section, key)) == NULL)
		return default_val;

	ret = atoi (val);
	p_free (val);

	return ret;
}